

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O3

int Ivy_ManPropagateBuffers(Ivy_Man_t *p,int fUpdateLevel)

{
  Ivy_Obj_t *pNode;
  Ivy_Obj_t *pIVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  pVVar2 = p->vBufs;
  uVar3 = pVVar2->nSize;
  if ((int)uVar3 < 1) {
    uVar5 = 0;
  }
  else {
    iVar4 = p->nObjs[6] + p->nObjs[5];
    uVar6 = iVar4 * 100;
    uVar5 = 0;
    do {
      for (pNode = (Ivy_Obj_t *)pVVar2->pArray[(ulong)uVar3 - 1];
          uVar3 = *(uint *)&pNode->field_0x8 & 0xf, uVar3 == 7;
          pNode = Ivy_ObjReadFirstFanout(p,pNode)) {
      }
      pIVar1 = pNode;
      if (uVar3 == 4) {
        do {
          pIVar1 = (Ivy_Obj_t *)((ulong)pIVar1->pFanin0 & 0xfffffffffffffffe);
          uVar3 = *(uint *)&pIVar1->field_0x8 & 0xf;
          if ((uVar3 != 7) && (uVar3 != 4)) goto LAB_007e427f;
        } while (pNode != pIVar1);
        pVVar2 = p->vBufs;
        if (pVVar2->nSize < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
        }
        uVar3 = pVVar2->nSize - 1;
        pVVar2->nSize = uVar3;
      }
      else {
LAB_007e427f:
        Ivy_NodeFixBufferFanins(p,pNode,fUpdateLevel);
        if (uVar5 != uVar6 && SBORROW4(uVar5,uVar6) == (int)(uVar5 + iVar4 * -100) < 0) {
          printf("Structural hashing is not finished after %d forward latch moves.\n",(ulong)uVar6);
          puts("This circuit cannot be forward-retimed completely. Quitting.");
          return uVar5;
        }
        pVVar2 = p->vBufs;
        uVar3 = pVVar2->nSize;
      }
      uVar5 = uVar5 + 1;
    } while (0 < (int)uVar3);
  }
  return uVar5;
}

Assistant:

int Ivy_ManPropagateBuffers( Ivy_Man_t * p, int fUpdateLevel )
{
    Ivy_Obj_t * pNode;
    int LimitFactor = 100;
    int NodeBeg = Ivy_ManNodeNum(p);
    int nSteps;
    for ( nSteps = 0; Vec_PtrSize(p->vBufs) > 0; nSteps++ )
    {
        pNode = (Ivy_Obj_t *)Vec_PtrEntryLast(p->vBufs);
        while ( Ivy_ObjIsBuf(pNode) )
            pNode = Ivy_ObjReadFirstFanout( p, pNode );
        // check if this buffer should remain
        if ( Ivy_ManLatchIsSelfFeed(pNode) )
        {
            Vec_PtrPop(p->vBufs);
            continue;
        }
//printf( "Propagating buffer %d with input %d and output %d\n", Ivy_ObjFaninId0(pNode), Ivy_ObjFaninId0(Ivy_ObjFanin0(pNode)), pNode->Id );
//printf( "Latch num %d\n", Ivy_ManLatchNum(p) );
        Ivy_NodeFixBufferFanins( p, pNode, fUpdateLevel );
        if ( nSteps > NodeBeg * LimitFactor )
        {
            printf( "Structural hashing is not finished after %d forward latch moves.\n", NodeBeg * LimitFactor );
            printf( "This circuit cannot be forward-retimed completely. Quitting.\n" );
            break;
        }
    }
//    printf( "Number of steps = %d. Nodes beg = %d. Nodes end = %d.\n", nSteps, NodeBeg, Ivy_ManNodeNum(p) );
    return nSteps;
}